

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode get_cert_chain(connectdata *conn,ssl_connect_data *connssl)

{
  ASN1_INTEGER *pAVar1;
  Curl_easy *data_00;
  int certnum;
  OPENSSL_STACK *pOVar2;
  BIO_METHOD *type;
  X509_NAME *pXVar3;
  undefined8 uVar4;
  stack_st_X509_EXTENSION *exts;
  ASN1_TIME *pAVar5;
  size_t sVar6;
  long info_len_9;
  long info_len_8;
  BIGNUM *pub_key_1;
  BIGNUM *g_1;
  BIGNUM *q_1;
  BIGNUM *p_1;
  DH *dh;
  BIGNUM *pub_key;
  BIGNUM *g;
  BIGNUM *q;
  BIGNUM *p;
  DSA *dsa;
  long info_len_7;
  BIGNUM *e;
  BIGNUM *n;
  RSA *rsa;
  size_t sStack_c8;
  int pktype;
  long info_len_6;
  long info_len_5;
  long info_len_4;
  ASN1_STRING *a;
  X509_ALGOR *palg;
  long info_len_3;
  long info_len_2;
  long info_len_1;
  long info_len;
  ASN1_BIT_STRING *psig;
  char *ptr;
  EVP_PKEY *pEStack_68;
  int j;
  EVP_PKEY *pubkey;
  X509 *x;
  ASN1_INTEGER *num;
  BIO *mem;
  Curl_easy *pCStack_40;
  int numcerts;
  Curl_easy *data;
  stack_st_X509 *psStack_30;
  int i;
  stack_st_X509 *sk;
  ssl_connect_data *psStack_20;
  CURLcode result;
  ssl_connect_data *connssl_local;
  connectdata *conn_local;
  
  pCStack_40 = conn->data;
  psStack_20 = connssl;
  connssl_local = (ssl_connect_data *)conn;
  psStack_30 = (stack_st_X509 *)SSL_get_peer_cert_chain((SSL *)connssl->handle);
  if (psStack_30 == (stack_st_X509 *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pOVar2 = ossl_check_const_X509_sk_type(psStack_30);
    mem._4_4_ = OPENSSL_sk_num(pOVar2);
    sk._4_4_ = Curl_ssl_init_certinfo(pCStack_40,mem._4_4_);
    conn_local._4_4_ = sk._4_4_;
    if (sk._4_4_ == CURLE_OK) {
      type = BIO_s_mem();
      num = (ASN1_INTEGER *)BIO_new(type);
      for (data._4_4_ = 0; data._4_4_ < mem._4_4_; data._4_4_ = data._4_4_ + 1) {
        pOVar2 = ossl_check_const_X509_sk_type(psStack_30);
        pubkey = (EVP_PKEY *)OPENSSL_sk_value(pOVar2,data._4_4_);
        pAVar1 = num;
        pEStack_68 = (EVP_PKEY *)0x0;
        info_len = 0;
        pXVar3 = X509_get_subject_name((X509 *)pubkey);
        X509_NAME_print_ex((BIO *)pAVar1,pXVar3,0,0x82031f);
        info_len_1 = BIO_ctrl((BIO *)num,3,0,&psig);
        Curl_ssl_push_certinfo_len(pCStack_40,data._4_4_,"Subject",(char *)psig,info_len_1);
        BIO_ctrl((BIO *)num,1,0,(void *)0x0);
        pAVar1 = num;
        pXVar3 = X509_get_issuer_name((X509 *)pubkey);
        X509_NAME_print_ex((BIO *)pAVar1,pXVar3,0,0x82031f);
        info_len_2 = BIO_ctrl((BIO *)num,3,0,&psig);
        Curl_ssl_push_certinfo_len(pCStack_40,data._4_4_,"Issuer",(char *)psig,info_len_2);
        BIO_ctrl((BIO *)num,1,0,(void *)0x0);
        pAVar1 = num;
        uVar4 = X509_get_version(pubkey);
        BIO_printf((BIO *)pAVar1,"%lx",uVar4);
        info_len_3 = BIO_ctrl((BIO *)num,3,0,&psig);
        Curl_ssl_push_certinfo_len(pCStack_40,data._4_4_,"Version",(char *)psig,info_len_3);
        BIO_ctrl((BIO *)num,1,0,(void *)0x0);
        x = (X509 *)X509_get_serialNumber((X509 *)pubkey);
        if (((ASN1_INTEGER *)x)->type == 0x102) {
          BIO_puts((BIO *)num,"-");
        }
        for (ptr._4_4_ = 0; ptr._4_4_ < *(int *)x; ptr._4_4_ = ptr._4_4_ + 1) {
          BIO_printf((BIO *)num,"%02x",(ulong)*(byte *)(*(long *)(x + 8) + (long)ptr._4_4_));
        }
        palg = (X509_ALGOR *)BIO_ctrl((BIO *)num,3,0,&psig);
        Curl_ssl_push_certinfo_len(pCStack_40,data._4_4_,"Serial Number",(char *)psig,(size_t)palg);
        BIO_ctrl((BIO *)num,1,0,(void *)0x0);
        a = (ASN1_STRING *)0x0;
        info_len_4 = (long)ASN1_STRING_new();
        if ((ASN1_STRING *)info_len_4 != (ASN1_STRING *)0x0) {
          X509_get0_signature(&info_len,&a,pubkey);
          X509_signature_print((BIO *)num,(X509_ALGOR *)a,(ASN1_STRING *)info_len_4);
          ASN1_STRING_free((ASN1_STRING *)info_len_4);
          if (a != (ASN1_STRING *)0x0) {
            i2a_ASN1_OBJECT((BIO *)num,*(ASN1_OBJECT **)a);
            info_len_5 = BIO_ctrl((BIO *)num,3,0,&psig);
            Curl_ssl_push_certinfo_len
                      (pCStack_40,data._4_4_,"Public Key Algorithm",(char *)psig,info_len_5);
            BIO_ctrl((BIO *)num,1,0,(void *)0x0);
          }
        }
        certnum = data._4_4_;
        data_00 = pCStack_40;
        exts = (stack_st_X509_EXTENSION *)X509_get0_extensions(pubkey);
        X509V3_ext(data_00,certnum,exts);
        pAVar1 = num;
        pAVar5 = (ASN1_TIME *)X509_get0_notBefore(pubkey);
        ASN1_TIME_print((BIO *)pAVar1,pAVar5);
        info_len_6 = BIO_ctrl((BIO *)num,3,0,&psig);
        Curl_ssl_push_certinfo_len(pCStack_40,data._4_4_,"Start date",(char *)psig,info_len_6);
        BIO_ctrl((BIO *)num,1,0,(void *)0x0);
        pAVar1 = num;
        pAVar5 = (ASN1_TIME *)X509_get0_notAfter(pubkey);
        ASN1_TIME_print((BIO *)pAVar1,pAVar5);
        sStack_c8 = BIO_ctrl((BIO *)num,3,0,&psig);
        Curl_ssl_push_certinfo_len(pCStack_40,data._4_4_,"Expire date",(char *)psig,sStack_c8);
        BIO_ctrl((BIO *)num,1,0,(void *)0x0);
        pEStack_68 = X509_get_pubkey((X509 *)pubkey);
        if (pEStack_68 == (EVP_PKEY *)0x0) {
          Curl_infof(pCStack_40,"   Unable to load public key\n");
        }
        else {
          rsa._4_4_ = EVP_PKEY_get_id(pEStack_68);
          if (rsa._4_4_ == 6) {
            n = (BIGNUM *)EVP_PKEY_get0_RSA(pEStack_68);
            RSA_get0_key(n,&e,&info_len_7,0);
            BN_print(num,(BIGNUM *)e);
            dsa = (DSA *)BIO_ctrl((BIO *)num,3,0,&psig);
            Curl_ssl_push_certinfo_len
                      (pCStack_40,data._4_4_,"RSA Public Key",(char *)psig,(size_t)dsa);
            BIO_ctrl((BIO *)num,1,0,(void *)0x0);
            pubkey_show(pCStack_40,(BIO *)num,data._4_4_,"rsa","n",e);
            pubkey_show(pCStack_40,(BIO *)num,data._4_4_,"rsa","e",(BIGNUM *)info_len_7);
          }
          else if (rsa._4_4_ == 0x1c) {
            p_1 = (BIGNUM *)EVP_PKEY_get0_DH(pEStack_68);
            DH_get0_pqg(p_1,&q_1,&g_1,&pub_key_1);
            DH_get0_key(p_1,&info_len_8,0);
            pubkey_show(pCStack_40,(BIO *)num,data._4_4_,"dh","p",q_1);
            pubkey_show(pCStack_40,(BIO *)num,data._4_4_,"dh","q",g_1);
            pubkey_show(pCStack_40,(BIO *)num,data._4_4_,"dh","g",pub_key_1);
            pubkey_show(pCStack_40,(BIO *)num,data._4_4_,"dh","pub_key",(BIGNUM *)info_len_8);
          }
          else if (rsa._4_4_ == 0x74) {
            p = (BIGNUM *)EVP_PKEY_get0_DSA(pEStack_68);
            DSA_get0_pqg(p,&q,&g,&pub_key);
            DSA_get0_key(p,&dh,0);
            pubkey_show(pCStack_40,(BIO *)num,data._4_4_,"dsa","p",q);
            pubkey_show(pCStack_40,(BIO *)num,data._4_4_,"dsa","q",g);
            pubkey_show(pCStack_40,(BIO *)num,data._4_4_,"dsa","g",pub_key);
            pubkey_show(pCStack_40,(BIO *)num,data._4_4_,"dsa","pub_key",(BIGNUM *)dh);
          }
          EVP_PKEY_free(pEStack_68);
        }
        if (info_len != 0) {
          for (ptr._4_4_ = 0; ptr._4_4_ < *(int *)info_len; ptr._4_4_ = ptr._4_4_ + 1) {
            BIO_printf((BIO *)num,"%02x:",
                       (ulong)*(byte *)(*(long *)(info_len + 8) + (long)ptr._4_4_));
          }
          sVar6 = BIO_ctrl((BIO *)num,3,0,&psig);
          Curl_ssl_push_certinfo_len(pCStack_40,data._4_4_,"Signature",(char *)psig,sVar6);
          BIO_ctrl((BIO *)num,1,0,(void *)0x0);
        }
        PEM_write_bio_X509((BIO *)num,(X509 *)pubkey);
        sVar6 = BIO_ctrl((BIO *)num,3,0,&psig);
        Curl_ssl_push_certinfo_len(pCStack_40,data._4_4_,"Cert",(char *)psig,sVar6);
        BIO_ctrl((BIO *)num,1,0,(void *)0x0);
      }
      BIO_free((BIO *)num);
      conn_local._4_4_ = CURLE_OK;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode get_cert_chain(struct connectdata *conn,
                               struct ssl_connect_data *connssl)

{
  CURLcode result;
  STACK_OF(X509) *sk;
  int i;
  struct Curl_easy *data = conn->data;
  int numcerts;
  BIO *mem;

  sk = SSL_get_peer_cert_chain(connssl->handle);
  if(!sk) {
    return CURLE_OUT_OF_MEMORY;
  }

  numcerts = sk_X509_num(sk);

  result = Curl_ssl_init_certinfo(data, numcerts);
  if(result) {
    return result;
  }

  mem = BIO_new(BIO_s_mem());

  for(i = 0; i < numcerts; i++) {
    ASN1_INTEGER *num;
    X509 *x = sk_X509_value(sk, i);
    EVP_PKEY *pubkey=NULL;
    int j;
    char *ptr;
    CONST_ASN1_BIT_STRING ASN1_BIT_STRING *psig = NULL;

    X509_NAME_print_ex(mem, X509_get_subject_name(x), 0, XN_FLAG_ONELINE);
    push_certinfo("Subject", i);

    X509_NAME_print_ex(mem, X509_get_issuer_name(x), 0, XN_FLAG_ONELINE);
    push_certinfo("Issuer", i);

    BIO_printf(mem, "%lx", X509_get_version(x));
    push_certinfo("Version", i);

    num = X509_get_serialNumber(x);
    if(num->type == V_ASN1_NEG_INTEGER)
      BIO_puts(mem, "-");
    for(j = 0; j < num->length; j++)
      BIO_printf(mem, "%02x", num->data[j]);
    push_certinfo("Serial Number", i);

#if defined(HAVE_X509_GET0_SIGNATURE) && defined(HAVE_X509_GET0_EXTENSIONS)
    {
      const X509_ALGOR *palg = NULL;
      ASN1_STRING *a = ASN1_STRING_new();
      if(a) {
        X509_get0_signature(&psig, &palg, x);
        X509_signature_print(mem, palg, a);
        ASN1_STRING_free(a);

        if(palg) {
          i2a_ASN1_OBJECT(mem, palg->algorithm);
          push_certinfo("Public Key Algorithm", i);
        }
      }
      X509V3_ext(data, i, X509_get0_extensions(x));
    }
#else
    {
      /* before OpenSSL 1.0.2 */
      X509_CINF *cinf = x->cert_info;

      i2a_ASN1_OBJECT(mem, cinf->signature->algorithm);
      push_certinfo("Signature Algorithm", i);

      i2a_ASN1_OBJECT(mem, cinf->key->algor->algorithm);
      push_certinfo("Public Key Algorithm", i);

      X509V3_ext(data, i, cinf->extensions);

      psig = x->signature;
    }
#endif

    ASN1_TIME_print(mem, X509_get0_notBefore(x));
    push_certinfo("Start date", i);

    ASN1_TIME_print(mem, X509_get0_notAfter(x));
    push_certinfo("Expire date", i);

    pubkey = X509_get_pubkey(x);
    if(!pubkey)
      infof(data, "   Unable to load public key\n");
    else {
      int pktype;
#ifdef HAVE_OPAQUE_EVP_PKEY
      pktype = EVP_PKEY_id(pubkey);
#else
      pktype = pubkey->type;
#endif
      switch(pktype) {
      case EVP_PKEY_RSA:
      {
        RSA *rsa;
#ifdef HAVE_OPAQUE_EVP_PKEY
        rsa = EVP_PKEY_get0_RSA(pubkey);
#else
        rsa = pubkey->pkey.rsa;
#endif

#ifdef HAVE_OPAQUE_RSA_DSA_DH
        {
          const BIGNUM *n;
          const BIGNUM *e;

          RSA_get0_key(rsa, &n, &e, NULL);
          BN_print(mem, n);
          push_certinfo("RSA Public Key", i);
          print_pubkey_BN(rsa, n, i);
          print_pubkey_BN(rsa, e, i);
        }
#else
        BIO_printf(mem, "%d", BN_num_bits(rsa->n));
        push_certinfo("RSA Public Key", i);
        print_pubkey_BN(rsa, n, i);
        print_pubkey_BN(rsa, e, i);
#endif

        break;
      }
      case EVP_PKEY_DSA:
      {
#ifndef OPENSSL_NO_DSA
        DSA *dsa;
#ifdef HAVE_OPAQUE_EVP_PKEY
        dsa = EVP_PKEY_get0_DSA(pubkey);
#else
        dsa = pubkey->pkey.dsa;
#endif
#ifdef HAVE_OPAQUE_RSA_DSA_DH
        {
          const BIGNUM *p;
          const BIGNUM *q;
          const BIGNUM *g;
          const BIGNUM *pub_key;

          DSA_get0_pqg(dsa, &p, &q, &g);
          DSA_get0_key(dsa, &pub_key, NULL);

          print_pubkey_BN(dsa, p, i);
          print_pubkey_BN(dsa, q, i);
          print_pubkey_BN(dsa, g, i);
          print_pubkey_BN(dsa, pub_key, i);
        }
#else
        print_pubkey_BN(dsa, p, i);
        print_pubkey_BN(dsa, q, i);
        print_pubkey_BN(dsa, g, i);
        print_pubkey_BN(dsa, pub_key, i);
#endif
#endif /* !OPENSSL_NO_DSA */
        break;
      }
      case EVP_PKEY_DH:
      {
        DH *dh;
#ifdef HAVE_OPAQUE_EVP_PKEY
        dh = EVP_PKEY_get0_DH(pubkey);
#else
        dh = pubkey->pkey.dh;
#endif
#ifdef HAVE_OPAQUE_RSA_DSA_DH
        {
          const BIGNUM *p;
          const BIGNUM *q;
          const BIGNUM *g;
          const BIGNUM *pub_key;
          DH_get0_pqg(dh, &p, &q, &g);
          DH_get0_key(dh, &pub_key, NULL);
          print_pubkey_BN(dh, p, i);
          print_pubkey_BN(dh, q, i);
          print_pubkey_BN(dh, g, i);
          print_pubkey_BN(dh, pub_key, i);
       }
#else
        print_pubkey_BN(dh, p, i);
        print_pubkey_BN(dh, g, i);
        print_pubkey_BN(dh, pub_key, i);
#endif
        break;
      }
#if 0
      case EVP_PKEY_EC: /* symbol not present in OpenSSL 0.9.6 */
        /* left TODO */
        break;
#endif
      }
      EVP_PKEY_free(pubkey);
    }

    if(psig) {
      for(j = 0; j < psig->length; j++)
        BIO_printf(mem, "%02x:", psig->data[j]);
      push_certinfo("Signature", i);
    }

    PEM_write_bio_X509(mem, x);
    push_certinfo("Cert", i);
  }

  BIO_free(mem);

  return CURLE_OK;
}